

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

FreeFormatParserReturnCode __thiscall
free_format_parser::HMpsFF::parse(HMpsFF *this,HighsLogOptions *log_options,string *filename)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  reference pvVar4;
  int iVar5;
  istream *in_RSI;
  istream *file;
  HighsLogOptions *in_RDI;
  bool *pbVar6;
  reference rVar7;
  HighsInt colidx;
  Exception *e;
  ifstream f;
  Parsekey keyword;
  _Bit_type in_stack_fffffffffffffbd8;
  HighsLogOptions *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  Parsekey in_stack_fffffffffffffbec;
  Parsekey in_stack_fffffffffffffbf8;
  Parsekey in_stack_fffffffffffffbfc;
  Parsekey in_stack_fffffffffffffc00;
  Parsekey in_stack_fffffffffffffc04;
  istream *file_00;
  HighsLogOptions *in_stack_fffffffffffffc60;
  HMpsFF *in_stack_fffffffffffffc68;
  int local_390;
  allocator<char> local_369;
  string local_368 [32];
  istream *in_stack_fffffffffffffcb8;
  HighsLogOptions *in_stack_fffffffffffffcc0;
  HMpsFF *in_stack_fffffffffffffcc8;
  istream *in_stack_fffffffffffffd88;
  HighsLogOptions *in_stack_fffffffffffffd90;
  HMpsFF *in_stack_fffffffffffffd98;
  Parsekey in_stack_fffffffffffffdd4;
  istream *in_stack_fffffffffffffdd8;
  HighsLogOptions *in_stack_fffffffffffffde0;
  HMpsFF *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  Parsekey in_stack_fffffffffffffdf4;
  HMpsFF *in_stack_fffffffffffffdf8;
  HighsLogOptions *in_stack_fffffffffffffe00;
  HMpsFF *in_stack_fffffffffffffe08;
  Parsekey in_stack_fffffffffffffe84;
  istream *in_stack_fffffffffffffe88;
  HighsLogOptions *in_stack_fffffffffffffe90;
  HMpsFF *in_stack_fffffffffffffe98;
  HighsLogOptions *in_stack_fffffffffffffea0;
  HMpsFF *in_stack_fffffffffffffea8;
  Parsekey local_24;
  istream *piVar8;
  HighsLogOptions *log_options_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  FreeFormatParserReturnCode FVar9;
  
  local_24 = kNone;
  piVar8 = in_RSI;
  log_options_00 = in_RDI;
  uVar2 = std::__cxx11::string::c_str();
  highsLogDev((HighsLogOptions *)in_RSI,kInfo,"readMPS: Trying to open file %s\n",uVar2);
  zstr::ifstream::ifstream
            ((ifstream *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  file_00 = (istream *)&local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,pcVar3,(allocator *)file_00);
  file = (istream *)local_368;
  zstr::ifstream::open((ifstream *)&stack0xfffffffffffffcb8,(char *)file,8);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  bVar1 = zstr::ifstream::is_open((ifstream *)0x45ce40);
  if (bVar1) {
    pbVar6 = (bool *)getWallTime();
    in_RDI->log_to_console = pbVar6;
    *(undefined4 *)&in_RDI->log_dev_level = 0;
    *(undefined4 *)((long)&in_RDI->log_dev_level + 4) = 0;
    *(undefined4 *)&in_RDI->user_log_callback = 0;
    *(undefined4 *)&in_RDI[4].user_callback_active = 0xffffffff;
    in_RDI[4].field_0x5c = 0;
    in_RDI[4].field_0x5d = 0;
    do {
      rVar7._M_mask = in_stack_fffffffffffffbd8;
      rVar7._M_p = (_Bit_type *)in_stack_fffffffffffffbe0;
      bVar1 = false;
      if ((local_24 != kFail) && (bVar1 = false, local_24 != kEnd)) {
        bVar1 = local_24 != kTimeout;
      }
      if (!bVar1) {
        for (local_390 = 0; in_stack_fffffffffffffbe0 = (HighsLogOptions *)rVar7._M_p,
            local_390 < *(int *)((long)&in_RDI->log_dev_level + 4); local_390 = local_390 + 1) {
          file = (istream *)(long)local_390;
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
          bVar1 = std::_Bit_reference::operator_cast_to_bool
                            ((_Bit_reference *)&stack0xfffffffffffffc60);
          if (bVar1) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &in_RDI[1].user_callback_active,(long)local_390);
            *pvVar4 = 0.0;
            file = (istream *)(long)local_390;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&in_RDI[2].log_to_console
                                ,(size_type)file);
            *pvVar4 = 1.0;
          }
        }
        if (local_24 == kFail) {
          zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,(int)file);
          FVar9 = kParserError;
        }
        else {
          zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,(int)file);
          in_stack_fffffffffffffbe0 = (HighsLogOptions *)rVar7._M_p;
          if (local_24 == kTimeout) {
            FVar9 = kTimeout;
          }
          else {
            FVar9 = kSuccess;
          }
        }
        goto LAB_0045d35e;
      }
      iVar5 = (int)piVar8;
      file = piVar8;
      bVar1 = cannotParseSection((HMpsFF *)
                                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                                 in_stack_fffffffffffffbe0,
                                 (Parsekey)(in_stack_fffffffffffffbd8 >> 0x20));
      if (bVar1) {
        zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,iVar5);
        FVar9 = kParserError;
        goto LAB_0045d35e;
      }
      piVar8 = file;
      switch(local_24) {
      case kObjsense:
        local_24 = parseObjsense(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,file_00);
        break;
      default:
        in_stack_fffffffffffffbec =
             parseDefault(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                          in_stack_fffffffffffffcb8);
        local_24 = in_stack_fffffffffffffbec;
        break;
      case kRows:
        local_24 = parseRows(in_stack_fffffffffffffdf8,
                             (HighsLogOptions *)
                             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                             (istream *)in_stack_fffffffffffffde8);
        break;
      case kCols:
        local_24 = parseCols((HMpsFF *)f.super_istream._40_8_,
                             (HighsLogOptions *)f.super_istream._32_8_,
                             (istream *)f.super_istream._24_8_);
        break;
      case kRhs:
        local_24 = parseRhs(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                            in_stack_fffffffffffffe88);
        break;
      case kBounds:
        in_stack_fffffffffffffc04 =
             parseBounds((HMpsFF *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         log_options_00,file);
        local_24 = in_stack_fffffffffffffc04;
        break;
      case kRanges:
        in_stack_fffffffffffffc00 =
             parseRanges(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (istream *)in_stack_fffffffffffffe98);
        local_24 = in_stack_fffffffffffffc00;
        break;
      case kQsection:
      case kQcmatrix:
        in_stack_fffffffffffffbf8 =
             parseQuadRows(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                           in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        local_24 = in_stack_fffffffffffffbf8;
        break;
      case kQmatrix:
      case kQuadobj:
        in_stack_fffffffffffffbfc =
             parseHessian(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
        local_24 = in_stack_fffffffffffffbfc;
        break;
      case kCsection:
        local_24 = parseCones(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88);
        break;
      case kSets:
      case kSos:
        local_24 = parseSos(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                            (istream *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
        break;
      case kFail:
        goto switchD_0045cf58_caseD_1a;
      case kFixedFormat:
        zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,iVar5);
        FVar9 = kFixedFormat;
        goto LAB_0045d35e;
      }
    } while( true );
  }
  iVar5 = 1;
  highsLogDev((HighsLogOptions *)piVar8,kInfo,"readMPS: Not opened file OK\n");
  zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,iVar5);
  FVar9 = kFileNotFound;
LAB_0045d35e:
  zstr::ifstream::~ifstream((ifstream *)in_stack_fffffffffffffbe0);
  return FVar9;
switchD_0045cf58_caseD_1a:
  zstr::ifstream::close((ifstream *)&stack0xfffffffffffffcb8,iVar5);
  FVar9 = kParserError;
  goto LAB_0045d35e;
}

Assistant:

FreeFormatParserReturnCode HMpsFF::parse(const HighsLogOptions& log_options,
                                         const std::string& filename) {
  HMpsFF::Parsekey keyword = HMpsFF::Parsekey::kNone;

  highsLogDev(log_options, HighsLogType::kInfo,
              "readMPS: Trying to open file %s\n", filename.c_str());
#ifdef ZLIB_FOUND
  zstr::ifstream f;
  try {
    f.open(filename.c_str(), std::ios::in);
  } catch (const strict_fstream::Exception& e) {
    highsLogDev(log_options, HighsLogType::kInfo, e.what());
    return FreeFormatParserReturnCode::kFileNotFound;
  }
#else
  std::ifstream f;
  f.open(filename.c_str(), std::ios::in);
#endif
  if (f.is_open()) {
    start_time = getWallTime();
    num_row = 0;
    num_col = 0;
    num_nz = 0;
    cost_row_location = -1;
    // Indicate that no duplicate rows or columns have been found
    has_duplicate_row_name_ = false;
    has_duplicate_col_name_ = false;
    // parsing loop
    while (keyword != HMpsFF::Parsekey::kFail &&
           keyword != HMpsFF::Parsekey::kEnd &&
           keyword != HMpsFF::Parsekey::kTimeout) {
      if (cannotParseSection(log_options, keyword)) {
        f.close();
        return FreeFormatParserReturnCode::kParserError;
      }
      switch (keyword) {
        case HMpsFF::Parsekey::kObjsense:
          keyword = parseObjsense(log_options, f);
          break;
        case HMpsFF::Parsekey::kRows:
          keyword = parseRows(log_options, f);
          break;
        case HMpsFF::Parsekey::kCols:
          keyword = parseCols(log_options, f);
          break;
        case HMpsFF::Parsekey::kRhs:
          keyword = parseRhs(log_options, f);
          break;
        case HMpsFF::Parsekey::kBounds:
          keyword = parseBounds(log_options, f);
          break;
        case HMpsFF::Parsekey::kRanges:
          keyword = parseRanges(log_options, f);
          break;
        case HMpsFF::Parsekey::kQmatrix:
        case HMpsFF::Parsekey::kQuadobj:
          keyword = parseHessian(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kQsection:
        case HMpsFF::Parsekey::kQcmatrix:
          keyword = parseQuadRows(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kCsection:
          keyword = parseCones(log_options, f);
          break;
        case HMpsFF::Parsekey::kSets:
        case HMpsFF::Parsekey::kSos:
          keyword = parseSos(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kFail:
          f.close();
          return FreeFormatParserReturnCode::kParserError;
        case HMpsFF::Parsekey::kFixedFormat:
          f.close();
          return FreeFormatParserReturnCode::kFixedFormat;
        default:
          keyword = parseDefault(log_options, f);
          break;
      }
    }

    // Assign bounds to columns that remain binary by default
    for (HighsInt colidx = 0; colidx < num_col; colidx++) {
      if (col_binary[colidx]) {
        col_lower[colidx] = 0.0;
        col_upper[colidx] = 1.0;
      }
    }

    if (keyword == HMpsFF::Parsekey::kFail) {
      f.close();
      return FreeFormatParserReturnCode::kParserError;
    }
  } else {
    highsLogDev(log_options, HighsLogType::kInfo,
                "readMPS: Not opened file OK\n");
    f.close();
    return FreeFormatParserReturnCode::kFileNotFound;
  }

  f.close();

  if (keyword == HMpsFF::Parsekey::kTimeout)
    return FreeFormatParserReturnCode::kTimeout;

  assert(col_lower.size() == static_cast<size_t>(num_col));
  assert(row_lower.size() == static_cast<size_t>(num_row));
  return FreeFormatParserReturnCode::kSuccess;
}